

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O2

void dlib::cpu::affine_transform(tensor *dest,tensor *src,float A,float B)

{
  uint *puVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar5;
  fatal_error *this;
  size_t i;
  ulong uVar6;
  string local_1b0;
  ostringstream dlib_o_out;
  uint auStack_178 [88];
  
  if (dest->m_size == src->m_size) {
    iVar3 = (*dest->_vptr_tensor[3])();
    iVar4 = (*src->_vptr_tensor[2])(src);
    uVar2 = src->m_size;
    for (uVar6 = 0; uVar6 < uVar2; uVar6 = uVar6 + 1) {
      *(float *)(CONCAT44(extraout_var,iVar3) + uVar6 * 4) =
           *(float *)(CONCAT44(extraout_var_00,iVar4) + uVar6 * 4) * A + B;
    }
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
  poVar5 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x19f);
  std::operator<<(poVar5,".\n");
  poVar5 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
  poVar5 = std::operator<<(poVar5,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                          );
  std::operator<<(poVar5,".\n");
  poVar5 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
  poVar5 = std::operator<<(poVar5,
                           "void dlib::cpu::affine_transform(tensor &, const tensor &, const float, const float)"
                          );
  std::operator<<(poVar5,".\n\n");
  poVar5 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
  poVar5 = std::operator<<(poVar5,"dest.size()==src.size()");
  std::operator<<(poVar5,".\n");
  puVar1 = (uint *)((long)auStack_178 + *(long *)(_dlib_o_out + -0x18));
  *puVar1 = *puVar1 | 1;
  poVar5 = std::operator<<((ostream *)&dlib_o_out,"");
  std::operator<<(poVar5,"\n");
  this = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this,EBROKEN_ASSERT,&local_1b0);
  __cxa_throw(this,&fatal_error::typeinfo,error::~error);
}

Assistant:

void affine_transform(
            tensor& dest,
            const tensor& src,
            const float A,
            const float B
        )
        {
            DLIB_CASSERT(dest.size()==src.size());
            const auto d = dest.host();
            const auto s = src.host();
            for (size_t i = 0; i < src.size(); ++i)
                d[i] = A*s[i] + B;
        }